

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int __thiscall
IDisk::AddMFMByteToAllTrack(IDisk *this,int side,int track,uint index,uchar byte,int datasize)

{
  int local_28;
  int d;
  int datasize_local;
  uchar byte_local;
  uint index_local;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  datasize_local = index;
  for (local_28 = 0; local_28 < datasize; local_28 = local_28 + 1) {
    if (this->side_[side].tracks[track].size <= (uint)datasize_local) {
      datasize_local = 0;
    }
    this->side_[side].tracks[track].bitfield[(uint)datasize_local] =
         (byte)((int)(uint)byte >> (((char)datasize + -1) - (char)local_28 & 0x1fU)) & 1;
    datasize_local = datasize_local + 1;
  }
  return datasize_local;
}

Assistant:

int IDisk::AddMFMByteToAllTrack(int side, int track, unsigned int index, unsigned char byte, int datasize)
{
   for (int d = 0; d < datasize; d++)
   {
      if (index >= side_[side].tracks[track].size)
      {
         index = 0;
      }
      side_[side].tracks[track].bitfield[index++] = ((byte >> (datasize - 1 - d)) & 0x01);
   }
   return index;
}